

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  GLenum GVar1;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,&local_11);
  GVar1 = this->colorbufferType;
  if (GVar1 != 0) {
    if (((GVar1 == 0x8d41) || (GVar1 == 0x8513)) || (GVar1 == 0xde1)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    getFormatName(this->colorbufferFormat);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->depthbufferType != 0) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    getFormatName(this->depthbufferFormat);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->stencilbufferType != 0) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    getFormatName(this->stencilbufferFormat);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::string name = "";

	if (colorbufferType != GL_NONE)
	{
		switch (colorbufferType)
		{
			case GL_TEXTURE_2D:			name += "tex2d_";	break;
			case GL_TEXTURE_CUBE_MAP:	name += "texcube_";	break;
			case GL_RENDERBUFFER:		name += "rbo_";		break;
			default:					DE_ASSERT(false);	break;
		}
		name += getFormatName(colorbufferFormat);
	}

	if (depthbufferType != GL_NONE)
	{
		DE_ASSERT(depthbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(depthbufferFormat);
	}

	if (stencilbufferType != GL_NONE)
	{
		DE_ASSERT(stencilbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(stencilbufferFormat);
	}

	return name;
}